

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O1

void __thiscall xercesc_4_0::ICUTransService::lowerCase(ICUTransService *this,XMLCh *toLowerCase)

{
  short *psVar1;
  XMLCh *pXVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar8 = 0;
  if (toLowerCase != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toLowerCase + uVar8);
      uVar8 = uVar8 + 2;
    } while (*psVar1 != 0);
    uVar8 = ((long)uVar8 >> 1) - 1;
  }
  lVar5 = 0;
  uVar6 = 0;
  do {
    if (uVar8 <= uVar6) break;
    pXVar2 = toLowerCase + uVar6;
    uVar7 = (uint)(ushort)*pXVar2;
    if ((uVar7 & 0xfc00) == 0xd800) {
      lVar3 = uVar6 + 1;
      uVar6 = uVar6 + 2;
      uVar7 = (uint)(ushort)*pXVar2 * 0x400 + (uint)(ushort)toLowerCase[lVar3] + 0xfca02400;
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar4 = u_tolower_70(uVar7);
    bVar9 = uVar6 - lVar5 != 1;
    if ((bVar9 || 0xffff < uVar7) || uVar4 < 0x10000) {
      if (uVar4 < 0x10000) {
        toLowerCase[lVar5] = (XMLCh)uVar4;
        lVar5 = lVar5 + 1;
      }
      else {
        toLowerCase[lVar5] = (short)(uVar4 >> 10) + L'ퟀ';
        toLowerCase[lVar5 + 1] = (XMLCh)uVar4 & 0x3ffU | 0xdc00;
        lVar5 = lVar5 + 2;
      }
    }
  } while ((bVar9 || 0xffff < uVar7) || uVar4 < 0x10000);
  toLowerCase[lVar5] = L'\0';
  return;
}

Assistant:

void ICUTransService::lowerCase(XMLCh* const toLowerCase)
{
    doCaseConvert(toLowerCase, u_tolower);
}